

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

void __thiscall pbrt::SquareMatrix<2>::SquareMatrix(SquareMatrix<2> *this,span<const_float> t)

{
  int i;
  ulong uVar1;
  int va;
  size_t vb;
  
  vb = t.n;
  va = 4;
  if (vb == 4) {
    uVar1 = 0;
    do {
      this->m[uVar1 >> 1 & 0x7fffffff][(uint)uVar1 & 1] = t.ptr[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar1 != 4);
    return;
  }
  LogFatal<char_const(&)[6],char_const(&)[9],char_const(&)[6],int&,char_const(&)[9],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
             ,0x618,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [6])"N * N",
             (char (*) [9])0x5cc00b,(char (*) [6])"N * N",&va,(char (*) [9])0x5cc00b,&vb);
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N>::SquareMatrix(pstd::span<const Float> t) {
    CHECK_EQ(N * N, t.size());
    for (int i = 0; i < N * N; ++i)
        m[i / N][i % N] = t[i];
}